

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O0

bool read_landmark_data(string *filename,
                       vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  istream *piVar4;
  undefined1 local_400 [8];
  LandmarkObs meas;
  double local_y;
  double local_x;
  istringstream iss_obs;
  string local_258 [8];
  string line_obs;
  long local_228;
  ifstream in_file_obs;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations_local;
  string *filename_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_228,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_258);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::istringstream::istringstream((istringstream *)&local_x,local_258,_S_in);
      std::istream::operator>>((istream *)&local_x,&local_y);
      std::istream::operator>>((istream *)&local_x,&meas.y);
      meas._0_8_ = local_y;
      meas.x = meas.y;
      std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
                (observations,(value_type *)local_400);
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_x);
    }
    filename_local._7_1_ = true;
    std::__cxx11::string::~string(local_258);
  }
  else {
    filename_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_228);
  return filename_local._7_1_;
}

Assistant:

inline bool read_landmark_data(const std::string& filename, std::vector<LandmarkObs>& observations) {

	// Get file of landmark measurements:
	std::ifstream in_file_obs(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_obs) {
		return false;
	}

	// Declare single line of landmark measurement file:
	std::string line_obs;

	// Run over each single line:
	while(getline(in_file_obs, line_obs)){

		std::istringstream iss_obs(line_obs);

		// Declare position values:
		double local_x, local_y;

		//read data from line to values:
		iss_obs >> local_x;
		iss_obs >> local_y;

		// Declare single landmark measurement:
		LandmarkObs meas;

		// Set values
		meas.x = local_x;
		meas.y = local_y;

		// Add to list of control measurements:
		observations.push_back(meas);
	}
	return true;
}